

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

DynamicFormat * get_format(string *name,string_view data,string *file_name)

{
  DynamicFormat *pDVar1;
  runtime_error *prVar2;
  string_view name_00;
  span<const_char,_18446744073709551615UL> data_00;
  string_view file_name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  name_00._M_str = data._M_str;
  data_00._M_extent._M_extent_value = data._M_len;
  if ((DynamicFormat *)name->_M_string_length == (DynamicFormat *)0x0) {
    data_00._M_ptr = name_00._M_str;
    file_name_00._M_str = (file_name->_M_dataplus)._M_p;
    file_name_00._M_len = file_name->_M_string_length;
    pDVar1 = ritobin::io::DynamicFormat::guess(data_00,file_name_00);
    if (pDVar1 == (DynamicFormat *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Failed to guess format for file: ",file_name);
      std::runtime_error::runtime_error(prVar2,(string *)&local_40);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    name_00._M_len = (size_t)(name->_M_dataplus)._M_p;
    pDVar1 = ritobin::io::DynamicFormat::get((DynamicFormat *)name->_M_string_length,name_00);
    if (pDVar1 == (DynamicFormat *)0x0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Format not found: ",name);
      std::runtime_error::runtime_error(prVar2,(string *)&local_40);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return pDVar1;
}

Assistant:

static DynamicFormat const* get_format(std::string const& name, std::string_view data, std::string const& file_name) {
    if (!name.empty()) {
        auto format = DynamicFormat::get(name);
        if (!format) {
            throw std::runtime_error("Format not found: " + name);
        }
        return format;
    } else {
        auto format = DynamicFormat::guess(data, file_name);
        if (!format) {
            throw std::runtime_error("Failed to guess format for file: " + file_name);
        }
        return format;
    }
}